

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.hh
# Opt level: O0

void __thiscall
avro::parsing::SimpleParser<avro::parsing::ResolvingDecoderHandler>::assertSize
          (SimpleParser<avro::parsing::ResolvingDecoderHandler> *this,size_t n)

{
  ostream *poVar1;
  Exception *this_00;
  size_t in_RSI;
  ostringstream oss;
  size_t s;
  string *in_stack_fffffffffffffe08;
  SimpleParser<avro::parsing::ResolvingDecoderHandler> *in_stack_fffffffffffffe20;
  ostringstream local_190 [376];
  size_t local_18;
  size_t local_10;
  
  local_10 = in_RSI;
  local_18 = popSize(in_stack_fffffffffffffe20);
  if (local_18 != local_10) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    poVar1 = std::operator<<((ostream *)local_190,"Incorrect size. Expected: ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_18);
    poVar1 = std::operator<<(poVar1," found ");
    std::ostream::operator<<(poVar1,local_10);
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::__cxx11::ostringstream::str();
    Exception::Exception(this_00,in_stack_fffffffffffffe08);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  return;
}

Assistant:

void assertSize(size_t n) {
        size_t s = popSize();
        if (s != n) {
            std::ostringstream oss;
            oss << "Incorrect size. Expected: " << s << " found " << n;
            throw Exception(oss.str());
        }
    }